

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::VerifyReferencedPropertyIdMap(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  void *pvVar5;
  ulong uVar6;
  
  uVar3 = GetCountField(this,ReferencedPropertyIdCount);
  if (uVar3 != 0) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar6 = 0;
    do {
      pvVar5 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,ReferencedPropertyIdMap);
      if (*(int *)((long)pvVar5 + uVar6 * 4) == -1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0x10d1,
                                    "(this->GetReferencedPropertyIdMap()[i] != Js::Constants::NoProperty)"
                                    ,
                                    "this->GetReferencedPropertyIdMap()[i] != Js::Constants::NoProperty"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      uVar6 = uVar6 + 1;
    } while (uVar3 != uVar6);
  }
  return;
}

Assistant:

void FunctionBody::VerifyReferencedPropertyIdMap()
    {
        uint count = this->GetReferencedPropertyIdCount();
        for (uint i = 0; i < count; i++)
        {
            Assert(this->GetReferencedPropertyIdMap()[i] != Js::Constants::NoProperty);
        }
    }